

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O3

s32 __thiscall irr::gui::CGUIFont::getCharacterFromPos(CGUIFont *this,wchar_t *text,s32 pixel_x)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  wchar_t wVar3;
  uint uVar4;
  pointer pSVar5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  long lVar8;
  long lVar9;
  u32 *puVar10;
  int iVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  u32 *puVar14;
  
  pSVar5 = (this->Areas).m_data.
           super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var6 = (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->CharacterMap)._M_t._M_impl.super__Rb_tree_header;
  puVar10 = &this->WrongCharacter;
  iVar11 = 0;
  lVar8 = 0;
  do {
    lVar9 = lVar8;
    wVar3 = text[lVar9];
    if (wVar3 == L'\0') {
      lVar9 = 0xffffffff;
      break;
    }
    p_Var12 = &p_Var1->_M_header;
    puVar14 = puVar10;
    p_Var13 = p_Var6;
    if (p_Var6 != (_Base_ptr)0x0) {
      do {
        p_Var2 = p_Var13 + 1;
        if (wVar3 <= (int)p_Var2->_M_color) {
          p_Var12 = p_Var13;
        }
        pp_Var7 = &p_Var13->_M_left;
        p_Var13 = pp_Var7[(int)p_Var2->_M_color < wVar3];
      } while (pp_Var7[(int)p_Var2->_M_color < wVar3] != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
         (puVar14 = (u32 *)&p_Var12[1].field_0x4, wVar3 < (int)p_Var12[1]._M_color)) {
        puVar14 = puVar10;
      }
    }
    uVar4 = *puVar14;
    iVar11 = iVar11 + pSVar5[uVar4].width + pSVar5[uVar4].overhang + pSVar5[uVar4].underhang +
             this->GlobalKerningWidth;
    lVar8 = lVar9 + 1;
  } while (iVar11 < pixel_x);
  return (s32)lVar9;
}

Assistant:

s32 CGUIFont::getCharacterFromPos(const wchar_t *text, s32 pixel_x) const
{
	s32 x = 0;
	s32 idx = 0;

	while (text[idx]) {
		const SFontArea &a = Areas[getAreaFromCharacter(text[idx])];

		x += a.width + a.overhang + a.underhang + GlobalKerningWidth;

		if (x >= pixel_x)
			return idx;

		++idx;
	}

	return -1;
}